

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O1

Vec_Bit_t * Acec_MapXorIns(Gia_Man_t *p,Vec_Int_t *vXors)

{
  uint uVar1;
  int *piVar2;
  Vec_Bit_t *pVVar3;
  int *__s;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  iVar7 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  pVVar3 = (Vec_Bit_t *)malloc(0x10);
  pVVar3->nSize = 0;
  iVar6 = iVar7 * 0x20;
  pVVar3->nCap = iVar6;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 * 4);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar6;
  memset(__s,0,(long)iVar7 << 2);
  iVar7 = vXors->nSize;
  if (0 < iVar7) {
    uVar4 = 1;
    do {
      if (iVar7 <= (int)uVar4) {
LAB_0067e315:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = vXors->pArray;
      uVar1 = piVar2[uVar4];
      if (((int)uVar1 < 0) || (iVar6 <= (int)uVar1)) {
LAB_0067e2f6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      if (iVar7 <= (int)(uVar4 + 1)) goto LAB_0067e315;
      uVar1 = piVar2[uVar4 + 1];
      if (((int)uVar1 < 0) || (iVar6 <= (int)uVar1)) goto LAB_0067e2f6;
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      if (iVar7 <= (int)(uVar4 + 2)) goto LAB_0067e315;
      uVar1 = piVar2[uVar4 + 2];
      if (((int)uVar1 < 0) || (iVar6 <= (int)uVar1)) goto LAB_0067e2f6;
      __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      iVar5 = uVar4 + 3;
      uVar4 = uVar4 + 4;
    } while (iVar5 < iVar7);
  }
  return pVVar3;
}

Assistant:

Vec_Bit_t * Acec_MapXorIns( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMap = Vec_BitStart( Gia_ManObjNum(p) ); int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
    {
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+1), 1 );
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+2), 1 );
        Vec_BitWriteEntry( vMap, Vec_IntEntry(vXors, 4*i+3), 1 );
    }
    return vMap;
}